

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArchiveWrite.cxx
# Opt level: O0

void __thiscall
cmArchiveWrite::cmArchiveWrite
          (cmArchiveWrite *this,ostream *os,Compress c,string *format,int compressionLevel,
          int numThreads)

{
  int iVar1;
  archive *paVar2;
  int *piVar3;
  ulong uVar4;
  char *pcVar5;
  char *v;
  int local_484;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350 [8];
  string archiveFilterName;
  string compressionLevelStr;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  undefined1 local_150 [8];
  string source_date_epoch;
  string local_110;
  string local_f0;
  string local_d0;
  int local_ac;
  string local_a8;
  string local_88;
  undefined1 local_68 [8];
  string sNumThreads;
  int local_40 [2];
  int upperLimit;
  int local_30;
  int local_2c;
  int numThreads_local;
  int compressionLevel_local;
  string *format_local;
  ostream *poStack_18;
  Compress c_local;
  ostream *os_local;
  cmArchiveWrite *this_local;
  
  this->Stream = os;
  local_30 = numThreads;
  local_2c = compressionLevel;
  _numThreads_local = format;
  format_local._4_4_ = c;
  poStack_18 = os;
  os_local = (ostream *)this;
  paVar2 = archive_write_new();
  this->Archive = paVar2;
  paVar2 = archive_read_disk_new();
  this->Disk = paVar2;
  this->Verbose = false;
  std::__cxx11::string::string((string *)&this->Format,(string *)_numThreads_local);
  std::__cxx11::string::string((string *)&this->Error);
  std::__cxx11::string::string((string *)&this->MTime);
  cmArchiveWriteOptional<int>::cmArchiveWriteOptional(&this->Uid);
  cmArchiveWriteOptional<int>::cmArchiveWriteOptional(&this->Gid);
  std::__cxx11::string::string((string *)&this->Uname);
  std::__cxx11::string::string((string *)&this->Gname);
  cmArchiveWriteOptional<int>::cmArchiveWriteOptional(&this->Permissions);
  cmArchiveWriteOptional<int>::cmArchiveWriteOptional(&this->PermissionsMask);
  if (local_30 < 1) {
    if (local_30 == 0) {
      local_484 = std::numeric_limits<int>::max();
    }
    else {
      local_484 = local_30;
      if (local_30 < 1) {
        local_484 = -local_30;
      }
    }
    local_40[0] = local_484;
    sNumThreads.field_2._12_4_ = std::thread::hardware_concurrency();
    sNumThreads.field_2._8_4_ = 1;
    piVar3 = std::clamp<int>((int *)(sNumThreads.field_2._M_local_buf + 0xc),
                             (int *)(sNumThreads.field_2._M_local_buf + 8),local_40);
    local_30 = *piVar3;
  }
  std::__cxx11::to_string((string *)local_68,local_30);
  switch(format_local._4_4_) {
  case CompressNone:
    iVar1 = archive_write_add_filter_none(this->Archive);
    if (iVar1 != 0) {
      cm_archive_error_string_abi_cxx11_(&local_a8,this->Archive);
      cmStrCat<char_const(&)[32],std::__cxx11::string>
                (&local_88,(char (*) [32])"archive_write_add_filter_none: ",&local_a8);
      std::__cxx11::string::operator=((string *)&this->Error,(string *)&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_a8);
      local_ac = 1;
      goto LAB_00144840;
    }
    break;
  case CompressCompress:
    iVar1 = archive_write_add_filter_compress(this->Archive);
    if (iVar1 != 0) {
      cm_archive_error_string_abi_cxx11_(&local_f0,this->Archive);
      cmStrCat<char_const(&)[36],std::__cxx11::string>
                (&local_d0,(char (*) [36])"archive_write_add_filter_compress: ",&local_f0);
      std::__cxx11::string::operator=((string *)&this->Error,(string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_f0);
      local_ac = 1;
      goto LAB_00144840;
    }
    break;
  case CompressGZip:
    iVar1 = archive_write_add_filter_gzip(this->Archive);
    if (iVar1 != 0) {
      cm_archive_error_string_abi_cxx11_
                ((string *)((long)&source_date_epoch.field_2 + 8),this->Archive);
      cmStrCat<char_const(&)[32],std::__cxx11::string>
                (&local_110,(char (*) [32])"archive_write_add_filter_gzip: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&source_date_epoch.field_2 + 8));
      std::__cxx11::string::operator=((string *)&this->Error,(string *)&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)(source_date_epoch.field_2._M_local_buf + 8));
      local_ac = 1;
      goto LAB_00144840;
    }
    std::__cxx11::string::string((string *)local_150);
    cmsys::SystemTools::GetEnv("SOURCE_DATE_EPOCH",(string *)local_150);
    uVar4 = std::__cxx11::string::empty();
    if (((uVar4 & 1) == 0) &&
       (iVar1 = archive_write_set_filter_option(this->Archive,"gzip","timestamp",(char *)0x0),
       iVar1 != 0)) {
      cm_archive_error_string_abi_cxx11_(&local_190,this->Archive);
      cmStrCat<char_const(&)[34],std::__cxx11::string>
                (&local_170,(char (*) [34])"archive_write_set_filter_option: ",&local_190);
      std::__cxx11::string::operator=((string *)&this->Error,(string *)&local_170);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_190);
      local_ac = 1;
    }
    else {
      local_ac = 0;
    }
    std::__cxx11::string::~string((string *)local_150);
    if (local_ac != 0) goto LAB_00144840;
    break;
  case CompressBZip2:
    iVar1 = archive_write_add_filter_bzip2(this->Archive);
    if (iVar1 != 0) {
      cm_archive_error_string_abi_cxx11_(&local_1d0,this->Archive);
      cmStrCat<char_const(&)[33],std::__cxx11::string>
                (&local_1b0,(char (*) [33])"archive_write_add_filter_bzip2: ",&local_1d0);
      std::__cxx11::string::operator=((string *)&this->Error,(string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_1d0);
      local_ac = 1;
      goto LAB_00144840;
    }
    break;
  case CompressLZMA:
    iVar1 = archive_write_add_filter_lzma(this->Archive);
    if (iVar1 != 0) {
      cm_archive_error_string_abi_cxx11_(&local_210,this->Archive);
      cmStrCat<char_const(&)[32],std::__cxx11::string>
                (&local_1f0,(char (*) [32])"archive_write_add_filter_lzma: ",&local_210);
      std::__cxx11::string::operator=((string *)&this->Error,(string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_210);
      local_ac = 1;
      goto LAB_00144840;
    }
    break;
  case CompressXZ:
    iVar1 = archive_write_add_filter_xz(this->Archive);
    if (iVar1 != 0) {
      cm_archive_error_string_abi_cxx11_(&local_250,this->Archive);
      cmStrCat<char_const(&)[30],std::__cxx11::string>
                (&local_230,(char (*) [30])"archive_write_add_filter_xz: ",&local_250);
      std::__cxx11::string::operator=((string *)&this->Error,(string *)&local_230);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::~string((string *)&local_250);
      local_ac = 1;
      goto LAB_00144840;
    }
    paVar2 = this->Archive;
    pcVar5 = (char *)std::__cxx11::string::c_str();
    iVar1 = archive_write_set_filter_option(paVar2,"xz","threads",pcVar5);
    if (iVar1 != 0) {
      cm_archive_error_string_abi_cxx11_(&local_290,this->Archive);
      cmStrCat<char_const(&)[32],std::__cxx11::string>
                (&local_270,(char (*) [32])"archive_compressor_xz_options: ",&local_290);
      std::__cxx11::string::operator=((string *)&this->Error,(string *)&local_270);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_290);
      local_ac = 1;
      goto LAB_00144840;
    }
    break;
  case CompressZstd:
    iVar1 = archive_write_add_filter_zstd(this->Archive);
    if (iVar1 != 0) {
      cm_archive_error_string_abi_cxx11_(&local_2d0,this->Archive);
      cmStrCat<char_const(&)[32],std::__cxx11::string>
                (&local_2b0,(char (*) [32])"archive_write_add_filter_zstd: ",&local_2d0);
      std::__cxx11::string::operator=((string *)&this->Error,(string *)&local_2b0);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::__cxx11::string::~string((string *)&local_2d0);
      local_ac = 1;
      goto LAB_00144840;
    }
    paVar2 = this->Archive;
    pcVar5 = (char *)std::__cxx11::string::c_str();
    iVar1 = archive_write_set_filter_option(paVar2,"zstd","threads",pcVar5);
    if (iVar1 != 0) {
      cm_archive_error_string_abi_cxx11_
                ((string *)((long)&compressionLevelStr.field_2 + 8),this->Archive);
      cmStrCat<char_const(&)[34],std::__cxx11::string>
                (&local_2f0,(char (*) [34])"archive_compressor_zstd_options: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&compressionLevelStr.field_2 + 8));
      std::__cxx11::string::operator=((string *)&this->Error,(string *)&local_2f0);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::__cxx11::string::~string((string *)(compressionLevelStr.field_2._M_local_buf + 8));
      local_ac = 1;
      goto LAB_00144840;
    }
  }
  if (local_2c != 0) {
    std::__cxx11::to_string((string *)((long)&archiveFilterName.field_2 + 8),local_2c);
    std::__cxx11::string::string(local_350);
    switch(format_local._4_4_) {
    case CompressNone:
    case CompressCompress:
      break;
    case CompressGZip:
      std::__cxx11::string::operator=(local_350,"gzip");
      break;
    case CompressBZip2:
      std::__cxx11::string::operator=(local_350,"bzip2");
      break;
    case CompressLZMA:
      std::__cxx11::string::operator=(local_350,"lzma");
      break;
    case CompressXZ:
      std::__cxx11::string::operator=(local_350,"xz");
      break;
    case CompressZstd:
      std::__cxx11::string::operator=(local_350,"zstd");
    }
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      paVar2 = this->Archive;
      pcVar5 = (char *)std::__cxx11::string::c_str();
      v = (char *)std::__cxx11::string::c_str();
      iVar1 = archive_write_set_filter_option(paVar2,pcVar5,"compression-level",v);
      if (iVar1 == 0) goto LAB_001445a7;
      cm_archive_error_string_abi_cxx11_(&local_390,this->Archive);
      cmStrCat<char_const(&)[34],std::__cxx11::string>
                (&local_370,(char (*) [34])"archive_write_set_filter_option: ",&local_390);
      std::__cxx11::string::operator=((string *)&this->Error,(string *)&local_370);
      std::__cxx11::string::~string((string *)&local_370);
      std::__cxx11::string::~string((string *)&local_390);
      local_ac = 1;
    }
    else {
LAB_001445a7:
      local_ac = 0;
    }
    std::__cxx11::string::~string(local_350);
    std::__cxx11::string::~string((string *)(archiveFilterName.field_2._M_local_buf + 8));
    if (local_ac != 0) goto LAB_00144840;
  }
  iVar1 = archive_read_disk_set_standard_lookup(this->Disk);
  if (iVar1 == 0) {
    paVar2 = this->Archive;
    pcVar5 = (char *)std::__cxx11::string::c_str();
    iVar1 = archive_write_set_format_by_name(paVar2,pcVar5);
    if (iVar1 == 0) {
      iVar1 = archive_write_set_bytes_in_last_block(this->Archive,1);
      if (iVar1 == 0) {
        local_ac = 0;
      }
      else {
        cm_archive_error_string_abi_cxx11_(&local_450,this->Archive);
        cmStrCat<char_const(&)[40],std::__cxx11::string>
                  (&local_430,(char (*) [40])"archive_write_set_bytes_in_last_block: ",&local_450);
        std::__cxx11::string::operator=((string *)&this->Error,(string *)&local_430);
        std::__cxx11::string::~string((string *)&local_430);
        std::__cxx11::string::~string((string *)&local_450);
        local_ac = 1;
      }
    }
    else {
      cm_archive_error_string_abi_cxx11_(&local_410,this->Archive);
      cmStrCat<char_const(&)[35],std::__cxx11::string>
                (&local_3f0,(char (*) [35])"archive_write_set_format_by_name: ",&local_410);
      std::__cxx11::string::operator=((string *)&this->Error,(string *)&local_3f0);
      std::__cxx11::string::~string((string *)&local_3f0);
      std::__cxx11::string::~string((string *)&local_410);
      local_ac = 1;
    }
  }
  else {
    cm_archive_error_string_abi_cxx11_(&local_3d0,this->Archive);
    cmStrCat<char_const(&)[40],std::__cxx11::string>
              (&local_3b0,(char (*) [40])"archive_read_disk_set_standard_lookup: ",&local_3d0);
    std::__cxx11::string::operator=((string *)&this->Error,(string *)&local_3b0);
    std::__cxx11::string::~string((string *)&local_3b0);
    std::__cxx11::string::~string((string *)&local_3d0);
    local_ac = 1;
  }
LAB_00144840:
  std::__cxx11::string::~string((string *)local_68);
  return;
}

Assistant:

cmArchiveWrite::cmArchiveWrite(std::ostream& os, Compress c,
                               std::string const& format, int compressionLevel,
                               int numThreads)
  : Stream(os)
  , Archive(archive_write_new())
  , Disk(archive_read_disk_new())
  , Format(format)
{
  // Upstream fixed an issue with their integer parsing in 3.4.0
  // which would cause spurious errors to be raised from `strtoull`.

  if (numThreads < 1) {
    int upperLimit = (numThreads == 0) ? std::numeric_limits<int>::max()
                                       : std::abs(numThreads);

    numThreads =
      cm::clamp<int>(std::thread::hardware_concurrency(), 1, upperLimit);
  }

  std::string sNumThreads = std::to_string(numThreads);

  switch (c) {
    case CompressNone:
      if (archive_write_add_filter_none(this->Archive) != ARCHIVE_OK) {
        this->Error = cmStrCat("archive_write_add_filter_none: ",
                               cm_archive_error_string(this->Archive));
        return;
      }
      break;
    case CompressCompress:
      if (archive_write_add_filter_compress(this->Archive) != ARCHIVE_OK) {
        this->Error = cmStrCat("archive_write_add_filter_compress: ",
                               cm_archive_error_string(this->Archive));
        return;
      }
      break;
    case CompressGZip: {
      if (archive_write_add_filter_gzip(this->Archive) != ARCHIVE_OK) {
        this->Error = cmStrCat("archive_write_add_filter_gzip: ",
                               cm_archive_error_string(this->Archive));
        return;
      }
      std::string source_date_epoch;
      cmSystemTools::GetEnv("SOURCE_DATE_EPOCH", source_date_epoch);
      if (!source_date_epoch.empty()) {
        // We're not able to specify an arbitrary timestamp for gzip.
        // The next best thing is to omit the timestamp entirely.
        if (archive_write_set_filter_option(this->Archive, "gzip", "timestamp",
                                            nullptr) != ARCHIVE_OK) {
          this->Error = cmStrCat("archive_write_set_filter_option: ",
                                 cm_archive_error_string(this->Archive));
          return;
        }
      }
    } break;
    case CompressBZip2:
      if (archive_write_add_filter_bzip2(this->Archive) != ARCHIVE_OK) {
        this->Error = cmStrCat("archive_write_add_filter_bzip2: ",
                               cm_archive_error_string(this->Archive));
        return;
      }
      break;
    case CompressLZMA:
      if (archive_write_add_filter_lzma(this->Archive) != ARCHIVE_OK) {
        this->Error = cmStrCat("archive_write_add_filter_lzma: ",
                               cm_archive_error_string(this->Archive));
        return;
      }
      break;
    case CompressXZ:
      if (archive_write_add_filter_xz(this->Archive) != ARCHIVE_OK) {
        this->Error = cmStrCat("archive_write_add_filter_xz: ",
                               cm_archive_error_string(this->Archive));
        return;
      }

#if ARCHIVE_VERSION_NUMBER >= 3004000

#  ifdef _AIX
      // FIXME: Using more than 2 threads creates an empty archive.
      // Enforce this limit pending further investigation.
      if (numThreads > 2) {
        numThreads = 2;
        sNumThreads = std::to_string(numThreads);
      }
#  endif
      if (archive_write_set_filter_option(this->Archive, "xz", "threads",
                                          sNumThreads.c_str()) != ARCHIVE_OK) {
        this->Error = cmStrCat("archive_compressor_xz_options: ",
                               cm_archive_error_string(this->Archive));
        return;
      }
#endif

      break;
    case CompressZstd:
      if (archive_write_add_filter_zstd(this->Archive) != ARCHIVE_OK) {
        this->Error = cmStrCat("archive_write_add_filter_zstd: ",
                               cm_archive_error_string(this->Archive));
        return;
      }

#if ARCHIVE_VERSION_NUMBER >= 3006000
      if (archive_write_set_filter_option(this->Archive, "zstd", "threads",
                                          sNumThreads.c_str()) != ARCHIVE_OK) {
        this->Error = cmStrCat("archive_compressor_zstd_options: ",
                               cm_archive_error_string(this->Archive));
        return;
      }
#endif
      break;
  }

  if (compressionLevel != 0) {
    std::string compressionLevelStr = std::to_string(compressionLevel);
    std::string archiveFilterName;
    switch (c) {
      case CompressNone:
      case CompressCompress:
        break;
      case CompressGZip:
        archiveFilterName = "gzip";
        break;
      case CompressBZip2:
        archiveFilterName = "bzip2";
        break;
      case CompressLZMA:
        archiveFilterName = "lzma";
        break;
      case CompressXZ:
        archiveFilterName = "xz";
        break;
      case CompressZstd:
        archiveFilterName = "zstd";
        break;
    }
    if (!archiveFilterName.empty()) {
      if (archive_write_set_filter_option(
            this->Archive, archiveFilterName.c_str(), "compression-level",
            compressionLevelStr.c_str()) != ARCHIVE_OK) {
        this->Error = cmStrCat("archive_write_set_filter_option: ",
                               cm_archive_error_string(this->Archive));
        return;
      }
    }
  }

#if !defined(_WIN32) || defined(__CYGWIN__)
  if (archive_read_disk_set_standard_lookup(this->Disk) != ARCHIVE_OK) {
    this->Error = cmStrCat("archive_read_disk_set_standard_lookup: ",
                           cm_archive_error_string(this->Archive));
    return;
  }
#endif

  if (archive_write_set_format_by_name(this->Archive, format.c_str()) !=
      ARCHIVE_OK) {
    this->Error = cmStrCat("archive_write_set_format_by_name: ",
                           cm_archive_error_string(this->Archive));
    return;
  }

  // do not pad the last block!!
  if (archive_write_set_bytes_in_last_block(this->Archive, 1)) {
    this->Error = cmStrCat("archive_write_set_bytes_in_last_block: ",
                           cm_archive_error_string(this->Archive));
    return;
  }
}